

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gettimeofday.c
# Opt level: O1

int run_test_gettimeofday(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_timeval64_t tv;
  undefined1 auStack_4c4 [4];
  undefined1 auStack_4c0 [16];
  char acStack_4b0 [120];
  char acStack_438 [216];
  char acStack_360 [312];
  char acStack_228 [248];
  char acStack_130 [264];
  
  iVar1 = uv_gettimeofday();
  if (iVar1 != 0) {
    run_test_gettimeofday_cold_1();
  }
  run_test_gettimeofday_cold_3();
  run_test_gettimeofday_cold_2();
  pcVar2 = (char *)uv_default_loop();
  pcVar4 = "127.0.0.1";
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_4c0);
  if (iVar1 == 0) {
    pcVar4 = pcVar2;
    iVar1 = uv_idle_init(pcVar2,acStack_4b0);
    if (iVar1 != 0) goto LAB_0015cced;
    pcVar4 = acStack_4b0;
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != -0x16) goto LAB_0015ccf2;
    uv_close(acStack_4b0,0);
    pcVar4 = pcVar2;
    iVar1 = uv_tcp_init(pcVar2,acStack_228);
    if (iVar1 != 0) goto LAB_0015ccf7;
    pcVar4 = acStack_228;
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != -9) goto LAB_0015ccfc;
    pcVar4 = acStack_228;
    iVar1 = uv_tcp_bind(pcVar4,auStack_4c0,0);
    if (iVar1 != 0) goto LAB_0015cd01;
    pcVar4 = acStack_228;
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != 0) goto LAB_0015cd06;
    pcVar4 = acStack_228;
    uv_close(pcVar4,0);
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != -9) goto LAB_0015cd0b;
    pcVar4 = pcVar2;
    iVar1 = uv_udp_init(pcVar2,acStack_438);
    if (iVar1 != 0) goto LAB_0015cd10;
    pcVar4 = acStack_438;
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != -9) goto LAB_0015cd15;
    pcVar4 = acStack_438;
    iVar1 = uv_udp_bind(pcVar4,auStack_4c0,0);
    if (iVar1 != 0) goto LAB_0015cd1a;
    pcVar4 = acStack_438;
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != 0) goto LAB_0015cd1f;
    pcVar4 = acStack_438;
    uv_close(pcVar4,0);
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != -9) goto LAB_0015cd24;
    pcVar4 = pcVar2;
    iVar1 = uv_pipe_init(pcVar2,acStack_130,0);
    if (iVar1 != 0) goto LAB_0015cd29;
    pcVar4 = acStack_130;
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != -9) goto LAB_0015cd2e;
    pcVar4 = acStack_130;
    iVar1 = uv_pipe_bind(pcVar4,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0015cd33;
    pcVar4 = acStack_130;
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != 0) goto LAB_0015cd38;
    pcVar4 = acStack_130;
    uv_close(pcVar4,0);
    iVar1 = uv_fileno(pcVar4);
    if (iVar1 != -9) goto LAB_0015cd3d;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 < 0) {
      run_test_handle_fileno_cold_26();
LAB_0015cc96:
      uv_run(pcVar2,0);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      pcVar4 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015cd42;
    }
    pcVar4 = pcVar2;
    iVar1 = uv_tty_init(pcVar2,acStack_360,iVar1,0);
    if (iVar1 != 0) goto LAB_0015cd47;
    pcVar4 = acStack_360;
    iVar1 = uv_is_readable(pcVar4);
    if (iVar1 == 0) goto LAB_0015cd4c;
    pcVar4 = acStack_360;
    iVar1 = uv_is_writable(pcVar4);
    if (iVar1 != 0) goto LAB_0015cd51;
    pcVar4 = acStack_360;
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != 0) goto LAB_0015cd56;
    pcVar4 = acStack_360;
    uv_close(pcVar4,0);
    iVar1 = uv_fileno(pcVar4,auStack_4c4);
    if (iVar1 != -9) goto LAB_0015cd5b;
    pcVar4 = acStack_360;
    iVar1 = uv_is_readable(pcVar4);
    if (iVar1 == 0) {
      pcVar4 = acStack_360;
      iVar1 = uv_is_writable(pcVar4);
      if (iVar1 != 0) goto LAB_0015cd65;
      goto LAB_0015cc96;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0015cced:
    run_test_handle_fileno_cold_2();
LAB_0015ccf2:
    run_test_handle_fileno_cold_3();
LAB_0015ccf7:
    run_test_handle_fileno_cold_4();
LAB_0015ccfc:
    run_test_handle_fileno_cold_5();
LAB_0015cd01:
    run_test_handle_fileno_cold_6();
LAB_0015cd06:
    run_test_handle_fileno_cold_7();
LAB_0015cd0b:
    run_test_handle_fileno_cold_8();
LAB_0015cd10:
    run_test_handle_fileno_cold_9();
LAB_0015cd15:
    run_test_handle_fileno_cold_10();
LAB_0015cd1a:
    run_test_handle_fileno_cold_11();
LAB_0015cd1f:
    run_test_handle_fileno_cold_12();
LAB_0015cd24:
    run_test_handle_fileno_cold_13();
LAB_0015cd29:
    run_test_handle_fileno_cold_14();
LAB_0015cd2e:
    run_test_handle_fileno_cold_15();
LAB_0015cd33:
    run_test_handle_fileno_cold_16();
LAB_0015cd38:
    run_test_handle_fileno_cold_17();
LAB_0015cd3d:
    run_test_handle_fileno_cold_18();
LAB_0015cd42:
    run_test_handle_fileno_cold_27();
LAB_0015cd47:
    run_test_handle_fileno_cold_19();
LAB_0015cd4c:
    run_test_handle_fileno_cold_25();
LAB_0015cd51:
    run_test_handle_fileno_cold_20();
LAB_0015cd56:
    run_test_handle_fileno_cold_21();
LAB_0015cd5b:
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0015cd65:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(gettimeofday) {
  uv_timeval64_t tv;
  int r;

  tv.tv_sec = 0;
  r = uv_gettimeofday(&tv);
  ASSERT(r == 0);
  ASSERT(tv.tv_sec != 0);

  /* Test invalid input. */
  r = uv_gettimeofday(NULL);
  ASSERT(r == UV_EINVAL);

  return 0;
}